

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
 __thiscall
booster::locale::impl_icu::generate_formatter<char>
          (impl_icu *this,ios_base *ios,Locale *locale,string *encoding)

{
  long *plVar1;
  ulong uVar2;
  Locale *locale_00;
  ios_info *this_00;
  uint64_t uVar3;
  icu_formatters_cache *this_01;
  unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
  uVar4;
  number_format<char> *pnVar5;
  NumberFormat *pNVar6;
  uint64_t uVar7;
  _Head_base<0UL,_icu_70::DateFormat_*,_false> this_02;
  TimeZone *pTVar8;
  date_format<char> *pdVar9;
  long lVar10;
  EStyle EVar11;
  uint uVar12;
  EStyle EVar13;
  undefined4 uVar14;
  icu_std_converter<char,_1> *ftime;
  string *this_03;
  UErrorCode err;
  _Head_base<0UL,_icu_70::DateFormat_*,_false> local_278;
  Locale *local_270;
  SimpleDateFormat *local_268;
  UnicodeString pattern;
  icu_std_converter<char,_1> cvt_;
  string local_1d0;
  string local_1b0;
  string local_190;
  icu_std_converter<char,_1> cvt__1;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  icu_std_converter<char,_1> local_70;
  
  *(undefined8 *)this = 0;
  this_00 = ios_info::get(ios);
  local_270 = locale;
  uVar3 = ios_info::display_flags(this_00);
  std::locale::locale((locale *)&pattern,(locale *)(ios + 0xd0));
  this_01 = std::use_facet<booster::locale::impl_icu::icu_formatters_cache>((locale *)&pattern);
  std::locale::~locale((locale *)&pattern);
  if (uVar3 == 0) {
    return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
              )this;
  }
  err = U_ZERO_ERROR;
  switch(uVar3) {
  case 1:
    uVar12 = *(uint *)(ios + 0x18) & 0x104;
    pNVar6 = icu_formatters_cache::number_format(this_01,(uint)(uVar12 == 0x100));
    (**(code **)(*(long *)pNVar6 + 0xe8))(pNVar6,*(undefined4 *)(ios + 8));
    if ((uVar12 == 0x100) || (uVar14 = 0, uVar12 == 4)) {
      uVar14 = *(undefined4 *)(ios + 8);
    }
    (**(code **)(*(long *)pNVar6 + 0xf0))(pNVar6,uVar14);
    pnVar5 = (number_format<char> *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_90,(string *)encoding);
    number_format<char>::number_format(pnVar5,pNVar6,&local_90);
    *(number_format<char> **)this = pnVar5;
    this_03 = &local_90;
    break;
  case 2:
    uVar3 = ios_info::currency_flags(this_00);
    pNVar6 = icu_formatters_cache::number_format
                       (this_01,fmt_curr_iso - ((uVar3 & 0xffffffffffffffbf) == 0));
    pnVar5 = (number_format<char> *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_b0,(string *)encoding);
    number_format<char>::number_format(pnVar5,pNVar6,&local_b0);
    *(number_format<char> **)this = pnVar5;
    this_03 = &local_b0;
    break;
  case 3:
    pNVar6 = icu_formatters_cache::number_format(this_01,fmt_per);
    (**(code **)(*(long *)pNVar6 + 0xe8))(pNVar6,*(undefined4 *)(ios + 8));
    if (((*(uint *)(ios + 0x18) & 0x104) == 0x100) ||
       (uVar14 = 0, (*(uint *)(ios + 0x18) & 0x104) == 4)) {
      uVar14 = *(undefined4 *)(ios + 8);
    }
    (**(code **)(*(long *)pNVar6 + 0xf0))(pNVar6,uVar14);
    pnVar5 = (number_format<char> *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_d0,(string *)encoding);
    number_format<char>::number_format(pnVar5,pNVar6,&local_d0);
    *(number_format<char> **)this = pnVar5;
    this_03 = &local_d0;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    local_268 = icu_formatters_cache::date_formatter(this_01);
    if (local_268 != (SimpleDateFormat *)0x0) {
      ios_info::time_flags(this_00);
      ios_info::date_flags(this_00);
      _pattern = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
      uVar4._M_t.
      super___uniq_ptr_impl<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_booster::locale::impl_icu::formatter<char>_*,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
      .super__Head_base<0UL,_booster::locale::impl_icu::formatter<char>_*,_false>._M_head_impl =
           (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )(*(code *)(&DAT_001b2528 + *(int *)(&DAT_001b2528 + (uVar3 - 4) * 4)))();
      return (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              )uVar4._M_t.
               super___uniq_ptr_impl<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_booster::locale::impl_icu::formatter<char>_*,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
               .super__Head_base<0UL,_booster::locale::impl_icu::formatter<char>_*,_false>.
               _M_head_impl;
    }
    uVar7 = ios_info::time_flags(this_00);
    uVar2 = uVar7 - 0x80 >> 7;
    EVar11 = SHORT - (int)uVar2;
    if (3 < (uVar7 << 0x39 | uVar2)) {
      EVar11 = DEFAULT;
    }
    uVar7 = ios_info::date_flags(this_00);
    locale_00 = local_270;
    uVar2 = uVar7 - 0x400 >> 10;
    EVar13 = DEFAULT;
    if ((uVar7 << 0x36 | uVar2) < 4) {
      EVar13 = SHORT - (int)uVar2;
    }
    if (uVar3 == 6) {
      this_02._M_head_impl =
           (DateFormat *)icu_70::DateFormat::createDateTimeInstance(EVar13,EVar11,local_270);
    }
    else if (uVar3 == 5) {
      this_02._M_head_impl = (DateFormat *)icu_70::DateFormat::createTimeInstance(EVar11,local_270);
    }
    else if (uVar3 == 4) {
      this_02._M_head_impl = (DateFormat *)icu_70::DateFormat::createDateInstance(EVar13,local_270);
    }
    else {
      std::__cxx11::string::string((string *)&local_190,(string *)encoding);
      icu_std_converter<char,_1>::icu_std_converter(&cvt__1,&local_190,cvt_skip);
      std::__cxx11::string::~string((string *)&local_190);
      ios_info::date_time_pattern<char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cvt_,this_00)
      ;
      icu_std_converter<char,_1>::icu(&local_70,(char_type *)&cvt__1,(char_type *)cvt_._0_8_);
      ftime = &local_70;
      strftime_to_icu((impl_icu *)&pattern,(UnicodeString *)ftime,locale_00);
      icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_70);
      this_02._M_head_impl =
           (DateFormat *)icu_70::UMemory::operator_new((UMemory *)0x360,(ulong)ftime);
      if (this_02._M_head_impl != (DateFormat *)0x0) {
        icu_70::SimpleDateFormat::SimpleDateFormat
                  ((SimpleDateFormat *)this_02._M_head_impl,&pattern,locale_00,&err);
      }
      icu_70::UnicodeString::~UnicodeString(&pattern);
      std::__cxx11::string::~string((string *)&cvt_);
      std::__cxx11::string::~string((string *)&cvt__1.charset_);
    }
    if (U_ZERO_ERROR < err) {
      if (this_02._M_head_impl == (DateFormat *)0x0) {
        return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                  )this;
      }
      lVar10 = *(long *)this_02._M_head_impl;
LAB_00191960:
      (**(code **)(lVar10 + 8))(this_02._M_head_impl);
      return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
              )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )this;
    }
    ios_info::time_zone_abi_cxx11_((string *)&pattern,this_00);
    pTVar8 = get_time_zone((string *)&pattern);
    (**(code **)(*(long *)this_02._M_head_impl + 0xb8))(this_02._M_head_impl,pTVar8);
    std::__cxx11::string::~string((string *)&pattern);
    if (this_02._M_head_impl != (DateFormat *)0x0) {
      pdVar9 = (date_format<char> *)operator_new(0x48);
      local_278._M_head_impl = this_02._M_head_impl;
      std::__cxx11::string::string((string *)&local_1b0,(string *)encoding);
      date_format<char>::date_format
                (pdVar9,(unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                        &local_278,&local_1b0);
      plVar1 = *(long **)this;
      *(date_format<char> **)this = pdVar9;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      std::__cxx11::string::~string((string *)&local_1b0);
      if (local_278._M_head_impl == (DateFormat *)0x0) {
        return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
                  )this;
      }
      lVar10 = *(long *)local_278._M_head_impl;
      this_02._M_head_impl = local_278._M_head_impl;
      goto LAB_00191960;
    }
    pdVar9 = (date_format<char> *)operator_new(0x48);
    std::__cxx11::string::string((string *)&local_1d0,(string *)encoding);
    date_format<char>::date_format(pdVar9,(DateFormat *)0x0,&local_1d0);
    plVar1 = *(long **)this;
    *(date_format<char> **)this = pdVar9;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    this_03 = &local_1d0;
    break;
  case 8:
    pnVar5 = (number_format<char> *)operator_new(0x40);
    pNVar6 = icu_formatters_cache::number_format(this_01,fmt_spell);
    std::__cxx11::string::string((string *)&local_f0,(string *)encoding);
    number_format<char>::number_format(pnVar5,pNVar6,&local_f0);
    *(number_format<char> **)this = pnVar5;
    this_03 = &local_f0;
    break;
  case 9:
    pnVar5 = (number_format<char> *)operator_new(0x40);
    pNVar6 = icu_formatters_cache::number_format(this_01,fmt_ord);
    std::__cxx11::string::string((string *)&local_110,(string *)encoding);
    number_format<char>::number_format(pnVar5,pNVar6,&local_110);
    *(number_format<char> **)this = pnVar5;
    this_03 = &local_110;
    break;
  default:
    goto switchD_00191345_default;
  }
  std::__cxx11::string::~string((string *)this_03);
switchD_00191345_default:
  return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
          )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<formatter<CharType> > generate_formatter(
                    std::ios_base &ios,
                    icu::Locale const &locale,
                    std::string const &encoding)
        {
            using namespace booster::locale::flags;

            std::unique_ptr<formatter<CharType> > fmt;
            ios_info &info=ios_info::get(ios);
            uint64_t disp = info.display_flags();

            icu_formatters_cache const &cache = std::use_facet<icu_formatters_cache>(ios.getloc());


            if(disp == posix)
                return fmt;
           
            UErrorCode err=U_ZERO_ERROR;
            
            switch(disp) {
            case number:
                {
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    icu::NumberFormat *nf = 0;

                    if(how == std::ios_base::scientific)
                        nf = cache.number_format(icu_formatters_cache::fmt_sci);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_number);
                    
                    nf->setMaximumFractionDigits(ios.precision());
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case currency:
                {
                    icu::NumberFormat *nf;
                    
                    uint64_t curr = info.currency_flags();

                    if(curr == currency_default || curr == currency_national)
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_nat);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_iso);

                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case percent:
                {
                    icu::NumberFormat *nf = cache.number_format(icu_formatters_cache::fmt_per);
                    nf->setMaximumFractionDigits(ios.precision());
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                    
                }
                break;
            case spellout:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_spell),encoding));
                break;
            case ordinal:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_ord),encoding));
                break;
            case date:
            case time:
            case datetime:
            case strftime:
                {
                    using namespace flags;
                    std::unique_ptr<icu::DateFormat> adf;
                    icu::DateFormat *df = 0;
                    icu::SimpleDateFormat *sdf = cache.date_formatter();
                    // try to use cached first
                    if(sdf) {
                        int tmf=info.time_flags();
                        switch(tmf) {
                        case time_short:
                            tmf=0;
                            break;
                        case time_long:
                            tmf=2;
                            break;
                        case time_full:
                            tmf=3;
                            break;
                        case time_default:
                        case time_medium:
                        default:
                            tmf=1;
                        }
                        int dtf=info.date_flags();
                        switch(dtf) {
                        case date_short:
                            dtf=0;
                            break;
                        case date_long:
                            dtf=2;
                            break;
                        case date_full:
                            dtf=3;
                            break;
                        case date_default:
                        case date_medium:
                        default:
                            dtf=1;
                        }

                        icu::UnicodeString pattern;
                        switch(disp) {
                        case date:
                            pattern = cache.date_format_[dtf];
                            break;
                        case time:
                            pattern = cache.time_format_[tmf];
                            break;
                        case datetime:
                            pattern = cache.date_time_format_[dtf][tmf];
                            break;
                        case strftime:
                            {
                                if( !cache.date_format_[1].isEmpty() 
                                    && !cache.time_format_[1].isEmpty()
                                    && !cache.date_time_format_[1][1].isEmpty())
                                {
                                    icu_std_converter<CharType> cvt_(encoding);
                                    std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                                    pattern = strftime_to_icu(cvt_.icu(f.c_str(),f.c_str()+f.size()),locale);
                                }
                            }
                            break;
                        }
                        if(!pattern.isEmpty()) {
                            sdf->applyPattern(pattern);
                            df = sdf;
                            sdf = 0;
                        }
                        sdf = 0;
                    }
                    
                    if(!df) {
                        icu::DateFormat::EStyle dstyle = icu::DateFormat::kDefault;
                        icu::DateFormat::EStyle tstyle = icu::DateFormat::kDefault;
                        
                        switch(info.time_flags()) {
                        case time_short:    tstyle=icu::DateFormat::kShort; break;
                        case time_medium:   tstyle=icu::DateFormat::kMedium; break;
                        case time_long:     tstyle=icu::DateFormat::kLong; break;
                        case time_full:     tstyle=icu::DateFormat::kFull; break;
                        }
                        switch(info.date_flags()) {
                        case date_short:    dstyle=icu::DateFormat::kShort; break;
                        case date_medium:   dstyle=icu::DateFormat::kMedium; break;
                        case date_long:     dstyle=icu::DateFormat::kLong; break;
                        case date_full:     dstyle=icu::DateFormat::kFull; break;
                        }
                        
                        if(disp==date)
                            adf.reset(icu::DateFormat::createDateInstance(dstyle,locale));
                        else if(disp==time)
                            adf.reset(icu::DateFormat::createTimeInstance(tstyle,locale));
                        else if(disp==datetime)
                            adf.reset(icu::DateFormat::createDateTimeInstance(dstyle,tstyle,locale));
                        else {// strftime
                            icu_std_converter<CharType> cvt_(encoding);
                            std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                            icu::UnicodeString fmt = strftime_to_icu(cvt_.icu(f.data(),f.data()+f.size()),locale);
                            adf.reset(new icu::SimpleDateFormat(fmt,locale,err));
                        }
                        if(U_FAILURE(err)) 
                            return fmt;
                        df = adf.get();
                    }

                    df->adoptTimeZone(get_time_zone(info.time_zone()));
                        
                    // Depending if we own formatter or not
                    if(adf.get())
                        fmt.reset(new date_format<CharType>(std::move(adf),encoding));
                    else
                        fmt.reset(new date_format<CharType>(std::move(df),encoding));
                }
                break;
            }

            return fmt;
        }